

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

string * httplib::detail::decode_url
                   (string *__return_storage_ptr__,string *s,bool convert_plus_to_space)

{
  char cVar1;
  pointer pcVar2;
  byte bVar3;
  uint uVar4;
  char cVar5;
  ulong uVar6;
  size_type __n;
  long lVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  char buff [4];
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar6 = s->_M_string_length;
  if (uVar6 != 0) {
    uVar11 = 0;
    do {
      pcVar2 = (s->_M_dataplus)._M_p;
      cVar1 = pcVar2[uVar11];
      if ((cVar1 == '%') && (uVar11 + 1 < uVar6)) {
        if (pcVar2[uVar11 + 1] == 'u') {
          uVar4 = 0;
          bVar12 = false;
          if (uVar11 + 2 < uVar6) {
            lVar7 = 0;
            uVar4 = 0;
            do {
              cVar1 = pcVar2[lVar7 + uVar11 + 2];
              iVar8 = (int)cVar1;
              if (cVar1 == '\0') {
LAB_00143a4f:
                bVar12 = false;
                goto LAB_00143a51;
              }
              uVar9 = iVar8 - 0x30;
              bVar12 = true;
              if (cVar1 < ' ' || 9 < uVar9) {
                if ((byte)(cVar1 + 0xbfU) < 6) {
                  uVar9 = iVar8 - 0x37;
                }
                else {
                  uVar9 = iVar8 - 0x57;
                  bVar12 = (byte)(cVar1 + 0x9fU) < 6;
                  if (!bVar12) {
                    uVar9 = 0;
                  }
                }
              }
              if (!bVar12) goto LAB_00143a4f;
              uVar4 = uVar4 * 0x10 + uVar9;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            bVar12 = true;
          }
LAB_00143a51:
          if (bVar12) {
            bVar3 = (byte)uVar4;
            if ((int)uVar4 < 0x80) {
              local_3c = bVar3 & 0x7f;
              __n = 1;
LAB_00143ad0:
              bVar12 = false;
            }
            else {
              if ((int)uVar4 < 0x800) {
                local_3c = (byte)(uVar4 >> 6) & 0x1f | 0xc0;
                local_3b = bVar3 & 0x3f | 0x80;
                __n = 2;
                goto LAB_00143ad0;
              }
              if ((int)uVar4 < 0xd800) {
LAB_00143aa7:
                local_3c = (byte)(uVar4 >> 0xc) & 0xf | 0xe0;
                local_3b = (byte)(uVar4 >> 6) & 0x3f | 0x80;
                local_3a = bVar3 & 0x3f | 0x80;
                __n = 3;
                goto LAB_00143ad0;
              }
              bVar12 = true;
              if (0xdfff < (int)uVar4) {
                if ((int)uVar4 < 0x10000) goto LAB_00143aa7;
                if ((int)uVar4 < 0x110000) {
                  local_3c = (byte)(uVar4 >> 0x12) & 7 | 0xf0;
                  local_3b = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
                  local_3a = (byte)(uVar4 >> 6) & 0x3f | 0x80;
                  local_39 = bVar3 & 0x3f | 0x80;
                  __n = 4;
                  goto LAB_00143ad0;
                }
              }
              __n = 0;
            }
            if (!bVar12) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(__return_storage_ptr__,(char *)&local_3c,__n);
            }
            uVar11 = uVar11 + 5;
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,'%');
          }
        }
        else {
          lVar7 = 0;
          iVar8 = 0;
          do {
            cVar5 = (char)iVar8;
            cVar1 = pcVar2[lVar7 + uVar11 + 1];
            iVar10 = (int)cVar1;
            if (cVar1 == '\0') {
LAB_00143a25:
              bVar12 = false;
              goto LAB_00143a27;
            }
            uVar4 = iVar10 - 0x30;
            bVar12 = true;
            if (cVar1 < ' ' || 9 < uVar4) {
              if ((byte)(cVar1 + 0xbfU) < 6) {
                uVar4 = iVar10 - 0x37;
              }
              else {
                uVar4 = iVar10 - 0x57;
                bVar12 = (byte)(cVar1 + 0x9fU) < 6;
                if (!bVar12) {
                  uVar4 = 0;
                }
              }
            }
            if (!bVar12) goto LAB_00143a25;
            iVar8 = iVar8 * 0x10 + uVar4;
            cVar5 = (char)iVar8;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 2);
          bVar12 = true;
LAB_00143a27:
          if (bVar12) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,cVar5);
            uVar11 = uVar11 + 2;
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,'%');
          }
        }
      }
      else {
        cVar5 = cVar1;
        if (convert_plus_to_space) {
          cVar5 = ' ';
        }
        if (cVar1 != '+') {
          cVar5 = cVar1;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,cVar5);
      }
      uVar11 = uVar11 + 1;
      uVar6 = s->_M_string_length;
    } while (uVar11 < uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string decode_url(const std::string &s,
                              bool convert_plus_to_space) {
  std::string result;

  for (size_t i = 0; i < s.size(); i++) {
    if (s[i] == '%' && i + 1 < s.size()) {
      if (s[i + 1] == 'u') {
        int val = 0;
        if (from_hex_to_i(s, i + 2, 4, val)) {
          // 4 digits Unicode codes
          char buff[4];
          size_t len = to_utf8(val, buff);
          if (len > 0) { result.append(buff, len); }
          i += 5; // 'u0000'
        } else {
          result += s[i];
        }
      } else {
        int val = 0;
        if (from_hex_to_i(s, i + 1, 2, val)) {
          // 2 digits hex codes
          result += static_cast<char>(val);
          i += 2; // '00'
        } else {
          result += s[i];
        }
      }
    } else if (convert_plus_to_space && s[i] == '+') {
      result += ' ';
    } else {
      result += s[i];
    }
  }

  return result;
}